

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::XThreadPaf::FulfillScope::FulfillScope(FulfillScope *this,XThreadPaf **pointer)

{
  Type *pTVar1;
  bool bVar2;
  Fault local_78;
  Fault f;
  Type *local_68;
  undefined1 local_60 [8];
  DebugComparison<kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)_&,_kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)>
  _kjCondition;
  Type local_2c;
  XThreadPaf *pXStack_28;
  Type oldState;
  undefined8 local_20;
  XThreadPaf **local_18;
  XThreadPaf **pointer_local;
  FulfillScope *this_local;
  
  local_20 = 0;
  LOCK();
  pXStack_28 = *pointer;
  *pointer = (XThreadPaf *)0x0;
  UNLOCK();
  this->obj = pXStack_28;
  if (this->obj != (XThreadPaf *)0x0) {
    pTVar1 = &this->obj->state;
    LOCK();
    local_2c = *pTVar1;
    _kjCondition._39_1_ = local_2c == WAITING;
    if ((bool)_kjCondition._39_1_) {
      *pTVar1 = FULFILLING;
      local_2c = WAITING;
    }
    UNLOCK();
    if (!(bool)_kjCondition._39_1_) {
      local_18 = pointer;
      pointer_local = &this->obj;
      local_68 = (Type *)DebugExpressionStart::operator<<
                                   ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_2c);
      f.exception._4_4_ = 4;
      DebugExpression<kj::_::XThreadPaf::{unnamed_type#1}&>::operator==
                ((DebugComparison<kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)_&,_kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)>
                  *)local_60,(DebugExpression<kj::_::XThreadPaf::_unnamed_type_1_&> *)&local_68,
                 (Type *)((long)&f.exception + 4));
      bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
      if (!bVar2) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadPaf::_unnamed_type_1_&,_unnamed_type_1_>&>
                  (&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x4c7,FAILED,"oldState == CANCELED","_kjCondition,",
                   (DebugComparison<kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)_&,_kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)>
                    *)local_60);
        Debug::Fault::fatal(&local_78);
      }
      if (this->obj != (XThreadPaf *)0x0) {
        (*(this->obj->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[6])();
      }
      this->obj = (XThreadPaf *)0x0;
    }
  }
  return;
}

Assistant:

XThreadPaf::FulfillScope::FulfillScope(XThreadPaf** pointer) {
  obj = __atomic_exchange_n(pointer, static_cast<XThreadPaf*>(nullptr), __ATOMIC_ACQUIRE);
  auto oldState = WAITING;
  if (obj == nullptr) {
    // Already fulfilled (possibly by another thread).
  } else if (__atomic_compare_exchange_n(&obj->state, &oldState, FULFILLING, false,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
    // Transitioned to FULFILLING, good.
  } else {
    // The waiting thread must have canceled.
    KJ_ASSERT(oldState == CANCELED);

    // It's our responsibility to clean up, then.
    delete obj;

    // Set `obj` null so that we don't try to fill it in or delete it later.
    obj = nullptr;
  }
}